

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LicenseReader_test.cpp
# Opt level: O2

void __thiscall read_env_var::test_method(read_env_var *this)

{
  bool bVar1;
  vector<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_> licenseInfos;
  long local_1128 [2];
  shared_count sStack_1118;
  undefined1 local_1110 [24];
  char *local_10f8;
  EventRegistry registry;
  char *local_10d8;
  char *local_10d0;
  LicenseReader licenseReader;
  char *local_10a8;
  char *local_10a0;
  undefined1 *local_1098;
  undefined1 *local_1090;
  char *local_1088;
  char *local_1080;
  char *local_1078;
  char *local_1070;
  undefined1 *local_1068;
  undefined1 *local_1060;
  char *local_1058;
  char *local_1050;
  LicenseLocation location;
  char str [4096];
  
  memcpy(str,
         "LIC_VAR=/workspace/llm4binary/github/license_all_cmakelists_25/abernste[P]open-license-manager/test/library/test_reader.ini"
         ,0x7c);
  putenv(str);
  location.openFileNearModule = false;
  location._17_7_ = 0;
  location.licenseFileLocation = (char *)0x0;
  location.environmentVariableName = "LIC_VAR";
  license::LicenseReader::LicenseReader(&licenseReader,&location);
  licenseInfos.
  super__Vector_base<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  licenseInfos.
  super__Vector_base<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  licenseInfos.
  super__Vector_base<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string((string *)local_1110,"PrODUCT",(allocator *)local_1128);
  license::LicenseReader::readLicenses(&registry,&licenseReader,(string *)local_1110,&licenseInfos);
  std::__cxx11::string::~string((string *)local_1110);
  local_1058 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/abernste[P]open-license-manager/test/library/LicenseReader_test.cpp"
  ;
  local_1050 = "";
  local_1068 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1060 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1058,0x4c);
  bVar1 = license::EventRegistry::isGood(&registry);
  local_1128[0] = CONCAT71(local_1128[0]._1_7_,bVar1);
  local_1128[1] = 0;
  sStack_1118.pi_ = (sp_counted_base *)0x0;
  local_10f8 = (char *)&local_10d8;
  local_10d8 = "registry.isGood()";
  local_10d0 = "";
  local_1110[8] = 0;
  local_1110._0_8_ = &PTR__lazy_ostream_0059deb0;
  local_1110._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_1078 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/abernste[P]open-license-manager/test/library/LicenseReader_test.cpp"
  ;
  local_1070 = "";
  boost::test_tools::tt_detail::report_assertion(local_1128,local_1110,&local_1078,0x4c,1,0,0);
  boost::detail::shared_count::~shared_count(&sStack_1118);
  local_1088 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/abernste[P]open-license-manager/test/library/LicenseReader_test.cpp"
  ;
  local_1080 = "";
  local_1098 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1090 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1088,0x4d);
  local_1110[8] = 0;
  local_1110._0_8_ = &PTR__lazy_ostream_0059df00;
  local_1110._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_10f8 = "";
  local_10a8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/abernste[P]open-license-manager/test/library/LicenseReader_test.cpp"
  ;
  local_10a0 = "";
  local_10d8 = (char *)CONCAT44(local_10d8._4_4_,1);
  local_1128[0] =
       (long)licenseInfos.
             super__Vector_base<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>
             ._M_impl.super__Vector_impl_data._M_finish -
       (long)licenseInfos.
             super__Vector_base<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>
             ._M_impl.super__Vector_impl_data._M_start >> 8;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,unsigned_long>
            (local_1110,&local_10a8,0x4d,1,2,&local_10d8,"1",local_1128,"licenseInfos.size()");
  std::_Vector_base<AuditEvent,_std::allocator<AuditEvent>_>::~_Vector_base
            ((_Vector_base<AuditEvent,_std::allocator<AuditEvent>_> *)&registry);
  std::vector<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>::~vector
            (&licenseInfos);
  license::LicenseReader::~LicenseReader(&licenseReader);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE( read_env_var ) {
	char str[MAX_PATH];
	strcpy(str,"LIC_VAR=" PROJECT_TEST_SRC_DIR "/library/test_reader.ini");
	putenv(str);
	const LicenseLocation location = { NULL, "LIC_VAR", false };
	LicenseReader licenseReader(location);
	vector<FullLicenseInfo> licenseInfos;
	EventRegistry registry = licenseReader.readLicenses("PrODUCT",
			licenseInfos);
	BOOST_CHECK(registry.isGood());
	BOOST_CHECK_EQUAL(1, licenseInfos.size());
}